

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O1

Path * __thiscall FileSystemUtils::Path::ParentPath(Path *__return_storage_ptr__,Path *this)

{
  string *psVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  long *local_48 [2];
  long local_38 [2];
  
  __return_storage_ptr__->_vptr_Path = (_func_int **)&PTR__Path_0011b8e8;
  psVar1 = &__return_storage_ptr__->m_string;
  (__return_storage_ptr__->m_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_string).field_2;
  pcVar2 = (this->m_string)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar2,pcVar2 + (this->m_string)._M_string_length);
  if ((__return_storage_ptr__->m_string)._M_string_length != 0) {
    while( true ) {
      uVar3 = std::__cxx11::string::find_last_of((char *)psVar1,0x116051,0xffffffffffffffff);
      uVar4 = (__return_storage_ptr__->m_string)._M_string_length - 1;
      if (uVar3 != uVar4) break;
      std::__cxx11::string::erase((ulong)psVar1,uVar4);
    }
    uVar3 = std::__cxx11::string::find_last_of((char *)psVar1,0x116051,0xffffffffffffffff);
    if (uVar3 < (__return_storage_ptr__->m_string)._M_string_length) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)psVar1);
      std::__cxx11::string::_M_assign((string *)psVar1);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      while( true ) {
        uVar3 = std::__cxx11::string::find_last_of((char *)psVar1,0x116051,0xffffffffffffffff);
        uVar4 = (__return_storage_ptr__->m_string)._M_string_length - 1;
        if (uVar3 != uVar4) break;
        std::__cxx11::string::erase((ulong)psVar1,uVar4);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(__return_storage_ptr__->m_string)._M_string_length,
                 0x1162e9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Path Path::ParentPath() const
	{
		Path parentpath = m_string;

        if( parentpath.m_string.length() == 0 )
        {
            return parentpath;
        }
		//remove any trailing seperators
		while( parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == parentpath.m_string.length()-1 )
		{
			parentpath.m_string.erase(parentpath.m_string.length()-1, 1);
		}

		size_t pos = parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS );
		if( pos < parentpath.m_string.length() )
		{
			parentpath = parentpath.m_string.substr(0, pos);

			//remove any trailing seperators
			while( parentpath.m_string.find_last_of( FILESYSTEMUTILS_SEPERATORS ) == parentpath.m_string.length()-1)
			{
                parentpath.m_string.erase(parentpath.m_string.length()-1, 1);
			}
		}
		else
		{
			// no seperators, so parentpath is empty path
			parentpath = "";
		}

		return parentpath;
	}